

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  int iVar2;
  sqlite3 *db;
  Op *pOVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  ushort uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  Mem *pMVar12;
  void *pvVar13;
  VdbeCursor **ppVVar14;
  int *piVar15;
  ushort uVar16;
  Mem *pMVar17;
  Mem **ppMVar18;
  ushort uVar19;
  ulong uVar20;
  u64 uVar21;
  int iVar22;
  size_t __n;
  long lVar23;
  long lVar24;
  u64 uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  bool bVar29;
  int nArg;
  int local_44;
  long local_40;
  long local_38;
  
  p->pVList = pParse->pVList;
  pParse->pVList = (VList *)0x0;
  db = p->db;
  sVar1 = pParse->nVar;
  iVar9 = pParse->nTab;
  local_38 = (long)iVar9;
  bVar29 = local_38 == 0;
  local_44 = pParse->nMaxArg;
  iVar22 = pParse->nMem + iVar9;
  lVar10 = (long)(p->nOp * 0x18);
  pOVar3 = p->aOp;
  iVar2 = pParse->szOpAlloc;
  resolveP2Values(p,&local_44);
  lVar8 = local_38;
  if (pParse->isMultiWrite == '\0') {
    uVar16 = 0;
  }
  else {
    uVar16 = (ushort)(pParse->mayAbort != '\0') << 5;
  }
  lVar11 = (long)sVar1;
  iVar22 = iVar22 + (uint)(0 < iVar22 && bVar29);
  uVar26 = iVar2 - lVar10 & 0xfffffffffffffff8;
  uVar7 = (ushort)*(undefined4 *)&p->field_0xc8;
  *(ushort *)&p->field_0xc8 = uVar16 | uVar7 & 0xffdf;
  if (pParse->explain != 0) {
    if (iVar22 < 0xb) {
      iVar22 = 10;
    }
    uVar19 = (pParse->explain & 3) << 2;
    *(ushort *)&p->field_0xc8 = uVar16 | uVar7 & 0xffd3 | uVar19;
    p->nResColumn = (ushort)(byte)((byte)uVar19 ^ 0xc);
  }
  p->field_0xc8 = p->field_0xc8 & 0xfc;
  local_40 = (long)iVar22 * 0x38;
  pMVar17 = (Mem *)0x0;
  uVar20 = uVar26 + (long)iVar22 * -0x38;
  pMVar12 = (Mem *)((long)pOVar3 + uVar20 + lVar10);
  lVar4 = 0;
  if (SBORROW8(uVar26,local_40) != (long)uVar20 < 0) {
    pMVar12 = pMVar17;
    lVar4 = local_40;
    uVar20 = uVar26;
  }
  p->aMem = pMVar12;
  lVar24 = lVar11 * 0x38;
  uVar26 = uVar20 + lVar11 * -0x38;
  pMVar12 = (Mem *)((long)pOVar3 + uVar26 + lVar10);
  lVar5 = 0;
  if (SBORROW8(uVar20,lVar24) != (long)uVar26 < 0) {
    pMVar12 = pMVar17;
    lVar5 = lVar24;
    uVar26 = uVar20;
  }
  p->aVar = pMVar12;
  lVar27 = (long)local_44;
  lVar28 = lVar27 * 8;
  uVar20 = uVar26 + lVar27 * -8;
  lVar23 = 0;
  if ((long)uVar26 < lVar28) {
    lVar23 = lVar28;
  }
  pMVar12 = (Mem *)((long)pOVar3 + uVar20 + lVar10);
  if (SBORROW8(uVar26,lVar28) != (long)uVar20 < 0) {
    pMVar12 = pMVar17;
    uVar20 = uVar26;
  }
  p->apArg = (Mem **)pMVar12;
  __n = local_38 * 8;
  pMVar12 = (Mem *)((long)pOVar3 + uVar20 + local_38 * -8 + lVar10);
  sVar6 = 0;
  if ((long)uVar20 < (long)__n) {
    pMVar12 = pMVar17;
    sVar6 = __n;
  }
  p->apCsr = (VdbeCursor **)pMVar12;
  uVar25 = sVar6 + lVar23 + lVar5 + lVar4;
  if (uVar25 != 0) {
    pvVar13 = sqlite3DbMallocRawNN(db,uVar25);
    p->pFree = pvVar13;
    if (db->mallocFailed == '\0') {
      pMVar12 = p->aMem;
      uVar21 = uVar25;
      if (pMVar12 == (Mem *)0x0) {
        uVar21 = uVar25 - local_40;
        if ((long)uVar25 < local_40) {
          pMVar12 = (Mem *)0x0;
          uVar21 = uVar25;
        }
        else {
          pMVar12 = (Mem *)((long)pvVar13 + uVar21);
        }
      }
      p->aMem = pMVar12;
      pMVar12 = p->aVar;
      uVar25 = uVar21;
      if (pMVar12 == (Mem *)0x0) {
        uVar25 = uVar21 + lVar11 * -0x38;
        if ((long)uVar21 < lVar24) {
          pMVar12 = (Mem *)0x0;
          uVar25 = uVar21;
        }
        else {
          pMVar12 = (Mem *)((long)pvVar13 + uVar25);
        }
      }
      p->aVar = pMVar12;
      ppMVar18 = p->apArg;
      uVar21 = uVar25;
      if (ppMVar18 == (Mem **)0x0) {
        uVar21 = uVar25 + lVar27 * -8;
        if ((long)uVar25 < lVar28) {
          ppMVar18 = (Mem **)0x0;
          uVar21 = uVar25;
        }
        else {
          ppMVar18 = (Mem **)((long)pvVar13 + uVar21);
        }
      }
      p->apArg = ppMVar18;
      ppVVar14 = p->apCsr;
      if (ppVVar14 == (VdbeCursor **)0x0) {
        if ((long)uVar21 < (long)__n) {
          ppVVar14 = (VdbeCursor **)0x0;
        }
        else {
          ppVVar14 = (VdbeCursor **)((long)pvVar13 + uVar21 + lVar8 * -8);
        }
      }
      p->apCsr = ppVVar14;
    }
  }
  if (db->mallocFailed == '\0') {
    p->nCursor = iVar9;
    p->nVar = sVar1;
    if (0 < sVar1) {
      iVar9 = sVar1 + 1;
      piVar15 = &p->aVar->szMalloc;
      do {
        *(u16 *)(piVar15 + -3) = 1;
        *(sqlite3 **)(piVar15 + -2) = db;
        *piVar15 = 0;
        iVar9 = iVar9 + -1;
        piVar15 = piVar15 + 0xe;
      } while (1 < iVar9);
    }
    p->nMem = iVar22;
    if (0 < iVar22) {
      iVar22 = iVar22 + 1;
      piVar15 = &p->aMem->szMalloc;
      do {
        *(u16 *)(piVar15 + -3) = 0;
        *(sqlite3 **)(piVar15 + -2) = db;
        *piVar15 = 0;
        iVar22 = iVar22 + -1;
        piVar15 = piVar15 + 0xe;
      } while (1 < iVar22);
    }
    memset(p->apCsr,0,__n);
  }
  else {
    p->nVar = 0;
    p->nMem = 0;
    p->nCursor = 0;
  }
  p->eVdbeState = '\x01';
  p->rc = 0;
  p->errorAction = '\x02';
  p->minWriteFileFormat = 0xff;
  p->nChange = 0;
  p->cacheCtr = 1;
  p->pc = -1;
  p->iStatement = 0;
  p->nFkConstraint = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int n;                         /* Loop counter */
  struct ReusableSpace x;        /* Reusable bulk memory */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->eVdbeState==VDBE_INIT_STATE );
  assert( pParse==p->pParse );
  p->pVList = pParse->pVList;
  pParse->pVList =  0;
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;

  /* Each cursor uses a memory cell.  The first cursor (cursor 0) can
  ** use aMem[0] which is not otherwise used by the VDBE program.  Allocate
  ** space at the end of aMem[] for cursors 1 and greater.
  ** See also: allocateCursor().
  */
  nMem += nCursor;
  if( nCursor==0 && nMem>0 ) nMem++;  /* Space for aMem[0] even if not used */

  /* Figure out how much reusable memory is available at the end of the
  ** opcode array.  This extra memory will be reallocated for other elements
  ** of the prepared statement.
  */
  n = ROUND8P(sizeof(Op)*p->nOp);             /* Bytes of opcode memory used */
  x.pSpace = &((u8*)p->aOp)[n];               /* Unused opcode memory */
  assert( EIGHT_BYTE_ALIGNMENT(x.pSpace) );
  x.nFree = ROUNDDOWN8(pParse->szOpAlloc - n);  /* Bytes of unused memory */
  assert( x.nFree>=0 );
  assert( EIGHT_BYTE_ALIGNMENT(&x.pSpace[x.nFree]) );

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain ){
    if( nMem<10 ) nMem = 10;
    p->explain = pParse->explain;
    p->nResColumn = 12 - 4*p->explain;
  }
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in one or two
  ** passes.  On the first pass, we try to reuse unused memory at the
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the remainder using a fresh memory allocation.
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover memory at the end of the opcode array.  This can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  x.nNeeded = 0;
  p->aMem = allocSpace(&x, 0, nMem*sizeof(Mem));
  p->aVar = allocSpace(&x, 0, nVar*sizeof(Mem));
  p->apArg = allocSpace(&x, 0, nArg*sizeof(Mem*));
  p->apCsr = allocSpace(&x, 0, nCursor*sizeof(VdbeCursor*));
  if( x.nNeeded ){
    x.pSpace = p->pFree = sqlite3DbMallocRawNN(db, x.nNeeded);
    x.nFree = x.nNeeded;
    if( !db->mallocFailed ){
      p->aMem = allocSpace(&x, p->aMem, nMem*sizeof(Mem));
      p->aVar = allocSpace(&x, p->aVar, nVar*sizeof(Mem));
      p->apArg = allocSpace(&x, p->apArg, nArg*sizeof(Mem*));
      p->apCsr = allocSpace(&x, p->apCsr, nCursor*sizeof(VdbeCursor*));
    }
  }

  if( db->mallocFailed ){
    p->nVar = 0;
    p->nCursor = 0;
    p->nMem = 0;
  }else{
    p->nCursor = nCursor;
    p->nVar = (ynVar)nVar;
    initMemArray(p->aVar, nVar, db, MEM_Null);
    p->nMem = nMem;
    initMemArray(p->aMem, nMem, db, MEM_Undefined);
    memset(p->apCsr, 0, nCursor*sizeof(VdbeCursor*));
  }
  sqlite3VdbeRewind(p);
}